

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_output_str(MIR_context_t ctx,FILE *f,MIR_str_t str)

{
  byte bVar1;
  ushort **ppuVar2;
  char *pcVar3;
  size_t i;
  size_t sVar4;
  
  fputc(0x22,(FILE *)f);
  sVar4 = 0;
  do {
    if (str.len == sVar4) {
      fputc(0x22,(FILE *)f);
      return;
    }
    bVar1 = str.s[sVar4];
    if (bVar1 == 0x22) {
      pcVar3 = "\\\"";
LAB_00117a40:
      fwrite(pcVar3,2,1,(FILE *)f);
    }
    else {
      if (bVar1 == 0x5c) {
        pcVar3 = "\\\\";
        goto LAB_00117a40;
      }
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 0x40) == 0) {
        switch(bVar1) {
        case 7:
          pcVar3 = "\\a";
          break;
        case 8:
          pcVar3 = "\\b";
          break;
        case 9:
          pcVar3 = "\\t";
          break;
        case 10:
          pcVar3 = "\\n";
          break;
        case 0xb:
          pcVar3 = "\\v";
          break;
        case 0xc:
          pcVar3 = "\\f";
          break;
        default:
          fprintf((FILE *)f,"\\%03o",(ulong)bVar1);
          goto LAB_00117ae5;
        }
        fwrite(pcVar3,2,1,(FILE *)f);
      }
      else {
        fputc((int)(char)bVar1,(FILE *)f);
      }
    }
LAB_00117ae5:
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

void MIR_output_str (MIR_context_t ctx MIR_UNUSED, FILE *f, MIR_str_t str) {
  fprintf (f, "\"");
  for (size_t i = 0; i < str.len; i++)
    if (str.s[i] == '\\')
      fprintf (f, "\\\\");
    else if (str.s[i] == '"')
      fprintf (f, "\\\"");
    else if (isprint (str.s[i]))
      fprintf (f, "%c", str.s[i]);
    else if (str.s[i] == '\n')
      fprintf (f, "\\n");
    else if (str.s[i] == '\t')
      fprintf (f, "\\t");
    else if (str.s[i] == '\v')
      fprintf (f, "\\v");
    else if (str.s[i] == '\a')
      fprintf (f, "\\a");
    else if (str.s[i] == '\b')
      fprintf (f, "\\b");
    else if (str.s[i] == '\f')
      fprintf (f, "\\f");
    else
      fprintf (f, "\\%03o", (unsigned char) str.s[i]);
  fprintf (f, "\"");
}